

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

string * __thiscall
pbrt::CameraSample::ToString_abi_cxx11_(string *__return_storage_ptr__,CameraSample *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point2<float>const&,pbrt::Point2<float>const&,float_const&,float_const&>
            (__return_storage_ptr__,"[ pFilm: %s pLens: %s time: %f weight: %f ]",&this->pFilm,
             &this->pLens,&this->time,&this->weight);
  return __return_storage_ptr__;
}

Assistant:

std::string CameraSample::ToString() const {
    return StringPrintf("[ pFilm: %s pLens: %s time: %f weight: %f ]", pFilm, pLens, time,
                        weight);
}